

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
::Matches(TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<const_solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<solitaire::piles::PileId>>,std::tuple<solitaire::piles::PileId>>
                    (&this->matchers_,args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::Matches
                         (&(this->extra_matcher_).
                           super_MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>,args);
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }